

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

void __thiscall
flatbuffers::JsonPrinter::GenField<double>
          (JsonPrinter *this,FieldDef *fd,Table *table,bool fixed,int indent)

{
  voffset_t field;
  undefined3 in_register_00000009;
  double defaultval;
  _Storage<double,_true> val;
  Optional<double> OVar1;
  
  if (CONCAT31(in_register_00000009,fixed) == 0) {
    if (fd->presence == kOptional) {
      OVar1 = Table::GetOptional<double,double>(table,(fd->value).offset);
      val = OVar1.super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_payload;
      if (((undefined1  [16])
           OVar1.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::string::append((char *)this->text);
        return;
      }
    }
    else {
      field = (fd->value).offset;
      defaultval = GetFieldDefault<double>(fd);
      val._M_value = Table::GetField<double>(table,field,defaultval);
    }
  }
  else {
    val = (_Storage<double,_true>)((_Storage<double,_true> *)(table + (fd->value).offset))->_M_value
    ;
  }
  PrintScalar<double>(this,val._M_value,&(fd->value).type,indent);
  return;
}

Assistant:

void GenField(const FieldDef &fd, const Table *table, bool fixed,
                int indent) {
    if (fixed) {
      PrintScalar(
          reinterpret_cast<const Struct *>(table)->GetField<T>(fd.value.offset),
          fd.value.type, indent);
    } else if (fd.IsOptional()) {
      auto opt = table->GetOptional<T, T>(fd.value.offset);
      if (opt) {
        PrintScalar(*opt, fd.value.type, indent);
      } else {
        text += "null";
      }
    } else {
      PrintScalar(table->GetField<T>(fd.value.offset, GetFieldDefault<T>(fd)),
                  fd.value.type, indent);
    }
  }